

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# List.hpp
# Opt level: O0

int __thiscall
Lib::List<Inferences::ALASCA::FourierMotzkinConf::Rhs>::remove
          (List<Inferences::ALASCA::FourierMotzkinConf::Rhs> *this,char *__filename)

{
  bool bVar1;
  List<Inferences::ALASCA::FourierMotzkinConf::Rhs> *pLVar2;
  List<Inferences::ALASCA::FourierMotzkinConf::Rhs> *next;
  List<Inferences::ALASCA::FourierMotzkinConf::Rhs> *current;
  List<Inferences::ALASCA::FourierMotzkinConf::Rhs> *result;
  size_t in_stack_ffffffffffffff18;
  void *in_stack_ffffffffffffff20;
  undefined7 in_stack_ffffffffffffff38;
  byte in_stack_ffffffffffffff3f;
  SelectedSummand *in_stack_ffffffffffffff40;
  List<Inferences::ALASCA::FourierMotzkinConf::Rhs> *in_stack_ffffffffffffff68;
  List<Inferences::ALASCA::FourierMotzkinConf::Rhs> *local_70;
  List<Inferences::ALASCA::FourierMotzkinConf::Rhs> *local_68;
  List<Inferences::ALASCA::FourierMotzkinConf::Rhs> *local_8;
  
  bVar1 = isEmpty((List<Inferences::ALASCA::FourierMotzkinConf::Rhs> *)__filename);
  if (bVar1) {
    local_8 = empty();
  }
  else {
    head(in_stack_ffffffffffffff68);
    bVar1 = Kernel::operator==(in_stack_ffffffffffffff40,
                               (SelectedSummand *)
                               CONCAT17(in_stack_ffffffffffffff3f,in_stack_ffffffffffffff38));
    Inferences::ALASCA::FourierMotzkinConf::Rhs::~Rhs((Rhs *)0x4054cd);
    if (bVar1) {
      local_8 = tail((List<Inferences::ALASCA::FourierMotzkinConf::Rhs> *)__filename);
      if (__filename != (char *)0x0) {
        ~List((List<Inferences::ALASCA::FourierMotzkinConf::Rhs> *)0x405509);
        operator_delete(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
      }
    }
    else {
      pLVar2 = tail((List<Inferences::ALASCA::FourierMotzkinConf::Rhs> *)__filename);
      bVar1 = isEmpty(pLVar2);
      local_8 = (List<Inferences::ALASCA::FourierMotzkinConf::Rhs> *)__filename;
      if (!bVar1) {
        local_70 = tail((List<Inferences::ALASCA::FourierMotzkinConf::Rhs> *)__filename);
        local_68 = (List<Inferences::ALASCA::FourierMotzkinConf::Rhs> *)__filename;
        do {
          head(in_stack_ffffffffffffff68);
          in_stack_ffffffffffffff3f =
               Kernel::operator==(in_stack_ffffffffffffff40,
                                  (SelectedSummand *)
                                  CONCAT17(in_stack_ffffffffffffff3f,in_stack_ffffffffffffff38));
          Inferences::ALASCA::FourierMotzkinConf::Rhs::~Rhs((Rhs *)0x4055d8);
          if ((in_stack_ffffffffffffff3f & 1) != 0) {
            pLVar2 = tail(local_70);
            setTail(local_68,pLVar2);
            if (local_70 != (List<Inferences::ALASCA::FourierMotzkinConf::Rhs> *)0x0) {
              ~List((List<Inferences::ALASCA::FourierMotzkinConf::Rhs> *)0x405620);
              operator_delete(local_68,in_stack_ffffffffffffff18);
            }
            break;
          }
          local_68 = local_70;
          local_70 = tail(local_70);
          bVar1 = isEmpty(local_70);
        } while (!bVar1);
      }
    }
  }
  return (int)local_8;
}

Assistant:

static List* remove (C elem, List* l)
  {
    if (isEmpty(l)) return empty();

    if (l->head() == elem) {
      List* result = l->tail();
      delete l;
      return result;
    }
    if (isEmpty(l->tail())) return l;

    List* current = l;
    List* next = l->tail();

    for (;;) {
      if (next->head() == elem) { // element found
        current->setTail(next->tail());
        delete next;
        return l;
      }
      current = next;
      next = next->tail();
      if (isEmpty(next)) return l;
    }
  }